

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexpr.h
# Opt level: O0

SExpr * SExprParseValue(SExprParser *parser)

{
  anon_union_8_5_1f899604_for_SExpr_2 aVar1;
  int iVar2;
  SExpr *pSVar3;
  long lVar4;
  SExpr *pSVar5;
  bool bVar6;
  bool bVar7;
  double dVar8;
  SExpr *elem;
  SExpr *tail;
  SExpr *list;
  SExpr *expr_3;
  SExpr *expr_1;
  SExpr *expr_2;
  char local_58 [7];
  bool isFloat;
  char buf [32];
  uint local_2c;
  int i;
  SExpr *expr;
  SExprString s;
  SExprParser *parser_local;
  
  s = (SExprString)parser;
  while( true ) {
    bVar6 = false;
    if (*(int *)((long)s + 0x14) != 0) {
      iVar2 = isspace(*(int *)((long)s + 0x14));
      bVar6 = iVar2 != 0;
    }
    if (!bVar6) break;
    if (*(int *)((long)s + 0x14) == 10) {
      *(int *)((long)s + 0x18) = *(int *)((long)s + 0x18) + 1;
    }
    iVar2 = SExprGetChar((SExprParser *)s);
    *(int *)((long)s + 0x14) = iVar2;
  }
  if (*(int *)((long)s + 0x14) == 0) {
    *(undefined4 *)((long)s + 0x30) = 3;
    *(char **)((long)s + 0x38) = "Unexpected EOF";
    return (SExpr *)0x0;
  }
  iVar2 = isalpha(*(int *)((long)s + 0x14));
  if (iVar2 != 0) {
    expr._4_4_ = 0;
    expr._0_4_ = *(int *)((long)s + 0x10) + -1;
    while( true ) {
      iVar2 = isalnum(*(int *)((long)s + 0x14));
      bVar6 = true;
      if (((((iVar2 == 0) && (bVar6 = true, *(int *)((long)s + 0x14) != 0x2d)) &&
           (bVar6 = true, *(int *)((long)s + 0x14) != 0x2b)) &&
          ((bVar6 = true, *(int *)((long)s + 0x14) != 0x2f &&
           (bVar6 = true, *(int *)((long)s + 0x14) != 0x2a)))) &&
         ((bVar6 = true, *(int *)((long)s + 0x14) != 0x24 &&
          ((bVar6 = true, *(int *)((long)s + 0x14) != 0x3f &&
           (bVar6 = true, *(int *)((long)s + 0x14) != 0x5f)))))) {
        bVar6 = *(int *)((long)s + 0x14) == 0x3d;
      }
      if (!bVar6) break;
      expr._4_4_ = expr._4_4_ + 1;
      iVar2 = SExprGetChar((SExprParser *)s);
      *(int *)((long)s + 0x14) = iVar2;
    }
    bVar6 = SExprStringEqual(*(char **)s,(SExprString *)&expr,"true");
    if (!bVar6) {
      bVar6 = SExprStringEqual(*(char **)s,(SExprString *)&expr,"false");
      if (!bVar6) {
        pSVar3 = SExprAlloc((SExprParser *)s,SE_ID);
        aVar1.s.len = expr._4_4_;
        aVar1.i = (int)expr;
        pSVar3->field_2 = aVar1;
        return pSVar3;
      }
      parser_local = (SExprParser *)&SExprParseValue::sfalse;
      SExprParseValue::sfalse.field_2.b = false;
      return (SExpr *)parser_local;
    }
    parser_local = (SExprParser *)&SExprParseValue::strue;
    SExprParseValue::strue.field_2.b = true;
    return (SExpr *)parser_local;
  }
  iVar2 = isdigit(*(int *)((long)s + 0x14));
  if (iVar2 == 0) {
    if (*(int *)((long)s + 0x14) == 0x2d) {
      iVar2 = SExprPeek((SExprParser *)s);
      iVar2 = isdigit(iVar2);
      if (iVar2 != 0) goto LAB_00108cb1;
    }
    if (*(int *)((long)s + 0x14) == 0x22) {
      parser_local = (SExprParser *)SExprAlloc((SExprParser *)s,SE_STRING);
      parser_local->last = 0;
      ((anon_union_8_5_1f899604_for_SExpr_2 *)&parser_local->pos)->i = *(int *)((long)s + 0x10);
      iVar2 = SExprGetChar((SExprParser *)s);
      *(int *)((long)s + 0x14) = iVar2;
      while( true ) {
        bVar6 = false;
        if (*(int *)((long)s + 0x14) != 0) {
          bVar6 = *(int *)((long)s + 0x14) != 0x22;
        }
        if (!bVar6) break;
        parser_local->last = parser_local->last + 1;
        iVar2 = SExprGetChar((SExprParser *)s);
        *(int *)((long)s + 0x14) = iVar2;
      }
      if (*(int *)((long)s + 0x14) == 0) {
        *(undefined4 *)((long)s + 0x30) = 3;
        *(char **)((long)s + 0x38) = "Unexpected EOF when expecting end of string.";
        parser_local = (SExprParser *)0x0;
      }
      else {
        iVar2 = SExprGetChar((SExprParser *)s);
        *(int *)((long)s + 0x14) = iVar2;
      }
    }
    else if (((*(int *)((long)s + 0x14) == 0x28) || (*(int *)((long)s + 0x14) == 0x5b)) ||
            (*(int *)((long)s + 0x14) == 0x7b)) {
      iVar2 = SExprGetChar((SExprParser *)s);
      *(int *)((long)s + 0x14) = iVar2;
      while( true ) {
        bVar6 = false;
        if (*(int *)((long)s + 0x14) != 0) {
          iVar2 = isspace(*(int *)((long)s + 0x14));
          bVar6 = iVar2 != 0;
        }
        if (!bVar6) break;
        if (*(int *)((long)s + 0x14) == 10) {
          *(int *)((long)s + 0x18) = *(int *)((long)s + 0x18) + 1;
        }
        iVar2 = SExprGetChar((SExprParser *)s);
        *(int *)((long)s + 0x14) = iVar2;
      }
      if (*(int *)((long)s + 0x14) == 0) {
        *(undefined4 *)((long)s + 0x30) = 3;
        *(char **)((long)s + 0x38) = "Unexpected EOF when expecting \')\' or list elements.";
        parser_local = (SExprParser *)0x0;
      }
      else if (((*(int *)((long)s + 0x14) == 0x29) || (*(int *)((long)s + 0x14) == 0x5d)) ||
              (*(int *)((long)s + 0x14) == 0x7d)) {
        iVar2 = SExprGetChar((SExprParser *)s);
        *(int *)((long)s + 0x14) = iVar2;
        parser_local = (SExprParser *)&SExprParseValue::nil;
      }
      else {
        pSVar3 = SExprAlloc((SExprParser *)s,SE_LIST);
        elem = (SExpr *)0x0;
        while( true ) {
          bVar6 = false;
          if (((*(int *)((long)s + 0x14) != 0) && (bVar6 = false, *(int *)((long)s + 0x14) != 0x29))
             && (bVar6 = false, *(int *)((long)s + 0x14) != 0x5d)) {
            bVar6 = *(int *)((long)s + 0x14) != 0x7d;
          }
          if (!bVar6) {
            if (*(int *)((long)s + 0x14) == 0) {
              *(undefined4 *)((long)s + 0x30) = 3;
              *(char **)((long)s + 0x38) = "Unexpected EOF when expecting end of list.";
              return (SExpr *)0x0;
            }
            iVar2 = SExprGetChar((SExprParser *)s);
            *(int *)((long)s + 0x14) = iVar2;
            return pSVar3;
          }
          pSVar5 = SExprParseValue((SExprParser *)s);
          if (pSVar5 == (SExpr *)0x0) break;
          if (elem == (SExpr *)0x0) {
            (pSVar3->field_2).head = pSVar5;
          }
          else {
            elem->next = pSVar5;
          }
          while( true ) {
            bVar6 = false;
            if (*(int *)((long)s + 0x14) != 0) {
              iVar2 = isspace(*(int *)((long)s + 0x14));
              bVar6 = iVar2 != 0;
            }
            elem = pSVar5;
            if (!bVar6) break;
            if (*(int *)((long)s + 0x14) == 10) {
              *(int *)((long)s + 0x18) = *(int *)((long)s + 0x18) + 1;
            }
            iVar2 = SExprGetChar((SExprParser *)s);
            *(int *)((long)s + 0x14) = iVar2;
          }
        }
        parser_local = (SExprParser *)0x0;
      }
    }
    else {
      *(undefined4 *)((long)s + 0x30) = 3;
      *(char **)((long)s + 0x38) = "Unexpected character";
      parser_local = (SExprParser *)0x0;
    }
  }
  else {
LAB_00108cb1:
    local_2c = 0;
    bVar6 = false;
    while( true ) {
      iVar2 = isdigit(*(int *)((long)s + 0x14));
      bVar7 = true;
      if ((iVar2 == 0) && ((bVar6 || (bVar7 = true, *(int *)((long)s + 0x14) != 0x2e)))) {
        bVar7 = *(int *)((long)s + 0x14) == 0x2d;
      }
      if (!bVar7) {
        local_58[(int)local_2c] = '\0';
        if (bVar6) {
          pSVar3 = SExprAlloc((SExprParser *)s,SE_FLOAT);
          dVar8 = strtod(local_58,(char **)0x0);
          (pSVar3->field_2).f = (float)dVar8;
          return pSVar3;
        }
        pSVar3 = SExprAlloc((SExprParser *)s,SE_INT);
        lVar4 = strtol(local_58,(char **)0x0,10);
        (pSVar3->field_2).i = (int)lVar4;
        return pSVar3;
      }
      if (0x1e < local_2c) break;
      if (*(int *)((long)s + 0x14) == 0x2e) {
        bVar6 = true;
      }
      local_58[(int)local_2c] = (char)*(undefined4 *)((long)s + 0x14);
      iVar2 = SExprGetChar((SExprParser *)s);
      *(int *)((long)s + 0x14) = iVar2;
      local_2c = local_2c + 1;
    }
    *(undefined4 *)((long)s + 0x30) = 3;
    *(char **)((long)s + 0x38) = "Numeric literal is too long.";
    parser_local = (SExprParser *)0x0;
  }
  return (SExpr *)parser_local;
}

Assistant:

SEXPR_DEF SExpr* SExprParseValue(SExprParser* parser)
{
    while(parser->last && isspace(parser->last)) {
        if(parser->last == '\n') {
            parser->lineNumber++;
        }

        parser->last = SExprGetChar(parser);
    }

    if(!parser->last) {
        parser->result.type = SE_SYNTAX_ERROR;
        parser->result.syntaxError.message = "Unexpected EOF";

        return NULL;
    }

    if(isalpha(parser->last)) {
        SExprString s;

        s.len = 0;
        s.start = parser->pos - 1;

        while(isalnum(parser->last) || parser->last == '-' ||
                parser->last == '+' || parser->last == '/' ||
                parser->last == '*' || parser->last == '$' ||
                parser->last == '?' || parser->last == '_' ||
                parser->last == '=') {
            s.len++;
            parser->last = SExprGetChar(parser);
        }

        if(SExprStringEqual(parser->src, &s, "true")) {
            static SExpr strue = {SE_BOOL};
            strue.b = true;

            return &strue;
        } else if(SExprStringEqual(parser->src, &s, "false")) {
            static SExpr sfalse = {SE_BOOL};
            sfalse.b = false;
            
            return &sfalse;
        }

        SExpr* expr = SExprAlloc(parser, SE_ID);
        expr->s = s;

        return expr;
    } else if(isdigit(parser->last) || (parser->last == '-' && isdigit(SExprPeek(parser)))) {
        int i = 0;
        char buf[32];

        bool isFloat = false;

        while(isdigit(parser->last) || (!isFloat && parser->last == '.') || parser->last == '-') {
            if(i >= sizeof(buf) - 1) {
                parser->result.type = SE_SYNTAX_ERROR;
                parser->result.syntaxError.message = "Numeric literal is too long.";
                return NULL;
            }

            if(parser->last == '.') {
                isFloat = true;
            }

            buf[i++] = parser->last;
            parser->last = SExprGetChar(parser);
        }

        buf[i] = '\0';

        if(isFloat) {
            SExpr* expr = SExprAlloc(parser, SE_FLOAT);
            expr->f = (float)strtod(buf, NULL);
            return expr;
        }    

        SExpr* expr = SExprAlloc(parser, SE_INT);
        expr->i = strtol(buf, NULL, 10);
        return expr;
    } else if(parser->last == '"') {
        SExpr* expr = SExprAlloc(parser, SE_STRING);

        expr->s.len = 0;
        expr->s.start = parser->pos;

        parser->last = SExprGetChar(parser);

        while(parser->last && parser->last != '"') {
            expr->s.len++;
            parser->last = SExprGetChar(parser);
        }

        if(!parser->last) {
            parser->result.type = SE_SYNTAX_ERROR;
            parser->result.syntaxError.message = "Unexpected EOF when expecting end of string.";
            return NULL;
        }

        parser->last = SExprGetChar(parser);

        return expr;
    } else if(parser->last == '(' || parser->last == '[' || parser->last == '{') {
        parser->last = SExprGetChar(parser);

        while(parser->last && isspace(parser->last)) {
			if(parser->last == '\n') {
				parser->lineNumber++;
			}
            parser->last = SExprGetChar(parser);
        }

        if(!parser->last) {
            parser->result.type = SE_SYNTAX_ERROR;
            parser->result.syntaxError.message = "Unexpected EOF when expecting ')' or list elements.";
            return NULL;
        }

        if(parser->last == ')' || parser->last == ']' || parser->last == '}') {
            parser->last = SExprGetChar(parser);
            
            static SExpr nil = {SE_NIL};
            return &nil;
        }

        SExpr* list = SExprAlloc(parser, SE_LIST);
        SExpr* tail = NULL;

        while(parser->last && parser->last != ')' && parser->last != ']' && parser->last != '}') {
            SExpr* elem = SExprParseValue(parser);

            if(!elem) {
                // There must have been an error
                return NULL;
            }

            if(!tail) {
                list->head = tail = elem;
            } else {
                tail->next = elem;
				tail = elem;
            }

			while(parser->last && isspace(parser->last)) {		
				if(parser->last == '\n') {
					parser->lineNumber++;
				}
				parser->last = SExprGetChar(parser);
			}
        }

        if(!parser->last) {
            parser->result.type = SE_SYNTAX_ERROR;
            parser->result.syntaxError.message = "Unexpected EOF when expecting end of list.";
            return NULL;
        }

        parser->last = SExprGetChar(parser);

        return list;
    }

    parser->result.type = SE_SYNTAX_ERROR;
    parser->result.syntaxError.message = "Unexpected character";
    return NULL;
}